

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O1

Fra_Cla_t * Fra_ClassesStart(Aig_Man_t *pAig)

{
  Fra_Cla_t *pFVar1;
  Aig_Obj_t **__s;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  size_t __size;
  
  pFVar1 = (Fra_Cla_t *)malloc(0x70);
  pFVar1->pAig = (Aig_Man_t *)0x0;
  pFVar1->pMemRepr = (Aig_Obj_t **)0x0;
  pFVar1->vClasses = (Vec_Ptr_t *)0x0;
  pFVar1->vClasses1 = (Vec_Ptr_t *)0x0;
  pFVar1->vClassesTemp = (Vec_Ptr_t *)0x0;
  pFVar1->pMemClasses = (Aig_Obj_t **)0x0;
  pFVar1->pMemClassesFree = (Aig_Obj_t **)0x0;
  pFVar1->vClassOld = (Vec_Ptr_t *)0x0;
  pFVar1->vClassNew = (Vec_Ptr_t *)0x0;
  pFVar1->nPairs = 0;
  pFVar1->fRefinement = 0;
  pFVar1->vImps = (Vec_Int_t *)0x0;
  pFVar1->pFuncNodeHash = (_func_int_Aig_Obj_t_ptr_int *)0x0;
  pFVar1->pFuncNodeIsConst = (_func_int_Aig_Obj_t_ptr *)0x0;
  pFVar1->pFuncNodesAreEqual = (_func_int_Aig_Obj_t_ptr_Aig_Obj_t_ptr *)0x0;
  pFVar1->pAig = pAig;
  __size = (long)pAig->vObjs->nSize << 3;
  __s = (Aig_Obj_t **)malloc(__size);
  pFVar1->pMemRepr = __s;
  memset(__s,0,__size);
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  pVVar2->pArray = ppvVar3;
  pFVar1->vClasses = pVVar2;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  pVVar2->pArray = ppvVar3;
  pFVar1->vClasses1 = pVVar2;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  pVVar2->pArray = ppvVar3;
  pFVar1->vClassesTemp = pVVar2;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  pVVar2->pArray = ppvVar3;
  pFVar1->vClassOld = pVVar2;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  pVVar2->pArray = ppvVar3;
  pFVar1->vClassNew = pVVar2;
  pFVar1->pFuncNodeHash = Fra_SmlNodeHash;
  pFVar1->pFuncNodeIsConst = Fra_SmlNodeIsConst;
  pFVar1->pFuncNodesAreEqual = Fra_SmlNodesAreEqual;
  return pFVar1;
}

Assistant:

Fra_Cla_t * Fra_ClassesStart( Aig_Man_t * pAig )
{
    Fra_Cla_t * p;
    p = ABC_ALLOC( Fra_Cla_t, 1 );
    memset( p, 0, sizeof(Fra_Cla_t) );
    p->pAig = pAig;
    p->pMemRepr  = ABC_ALLOC( Aig_Obj_t *, Aig_ManObjNumMax(pAig) );
    memset( p->pMemRepr, 0, sizeof(Aig_Obj_t *) * Aig_ManObjNumMax(pAig) );
    p->vClasses     = Vec_PtrAlloc( 100 );
    p->vClasses1    = Vec_PtrAlloc( 100 );
    p->vClassesTemp = Vec_PtrAlloc( 100 );
    p->vClassOld    = Vec_PtrAlloc( 100 );
    p->vClassNew    = Vec_PtrAlloc( 100 );
    p->pFuncNodeHash      = Fra_SmlNodeHash;
    p->pFuncNodeIsConst   = Fra_SmlNodeIsConst;
    p->pFuncNodesAreEqual = Fra_SmlNodesAreEqual;
    return p;
}